

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall Js::HeapArgumentsObject::SetItemAt(HeapArgumentsObject *this,uint32 index,Var value)

{
  BOOL BVar1;
  DynamicObject *this_00;
  Var value_local;
  uint32 index_local;
  HeapArgumentsObject *this_local;
  
  BVar1 = HasItemAt(this,index);
  if (BVar1 != 0) {
    this_00 = &Memory::WriteBarrierPtr<Js::ActivationObject>::operator->(&this->frameObject)->
               super_DynamicObject;
    DynamicObject::SetSlot(this_00,-1,false,index,value);
  }
  this_local._4_4_ = (uint)(BVar1 != 0);
  return this_local._4_4_;
}

Assistant:

BOOL HeapArgumentsObject::SetItemAt(uint32 index, Var value)
    {
        // If this arg index is bound to a named formal argument, set it in the local frame.
        // If not, report this fact to the caller, which will defer to the normal set-value-by-index means.
        if (HasItemAt(index))
        {
            this->frameObject->SetSlot(SetSlotArguments(Constants::NoProperty, index, value));
            return true;
        }

        return false;
    }